

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupTeamCityOutputTest::setup(TEST_GROUP_CppUTestGroupTeamCityOutputTest *this)

{
  TeamCityOutputToBuffer *this_00;
  UtestShell *pUVar1;
  TestFailure *pTVar2;
  TestResult *this_01;
  SimpleString SStack_28;
  
  this_00 = (TeamCityOutputToBuffer *)
            operator_new(0x48,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                         ,0x38);
  TeamCityOutputToBuffer::TeamCityOutputToBuffer(this_00);
  this->mock = this_00;
  this->tcout = (TeamCityTestOutput *)this_00;
  pUVar1 = (UtestShell *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                        ,0x3a);
  UtestShell::UtestShell(pUVar1,"group","test","file",10);
  this->tst = pUVar1;
  pTVar2 = (TestFailure *)
           operator_new(0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                        ,0x3b);
  pUVar1 = this->tst;
  SimpleString::SimpleString(&SStack_28,"failure message");
  TestFailure::TestFailure(pTVar2,pUVar1,"failfile",0x14,&SStack_28);
  this->f = pTVar2;
  SimpleString::~SimpleString(&SStack_28);
  pTVar2 = (TestFailure *)
           operator_new(0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                        ,0x3c);
  pUVar1 = this->tst;
  SimpleString::SimpleString(&SStack_28,"message");
  TestFailure::TestFailure(pTVar2,pUVar1,"file",0x14,&SStack_28);
  this->f2 = pTVar2;
  SimpleString::~SimpleString(&SStack_28);
  pTVar2 = (TestFailure *)
           operator_new(0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                        ,0x3d);
  pUVar1 = this->tst;
  SimpleString::SimpleString(&SStack_28,"apos\' pipe| [brackets]\r\nCRLF");
  TestFailure::TestFailure(pTVar2,pUVar1,"file",0x1e,&SStack_28);
  this->f3 = pTVar2;
  SimpleString::~SimpleString(&SStack_28);
  this_01 = (TestResult *)
            operator_new(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                         ,0x3e);
  TestResult::TestResult(this_01,(TestOutput *)this->mock);
  this->result = this_01;
  TestResult::setTotalExecutionTime(this_01,10);
  millisTime = 0;
  CppUTestStore(&GetPlatformSpecificTimeInMillis);
  GetPlatformSpecificTimeInMillis = MockGetPlatformSpecificTimeInMillis;
  return;
}

Assistant:

void setup() _override
    {
        mock = new TeamCityOutputToBuffer();
        tcout = mock;
        tst = new UtestShell("group", "test", "file", 10);
        f = new TestFailure(tst, "failfile", 20, "failure message");
        f2 = new TestFailure(tst, "file", 20, "message");
        f3 = new TestFailure(tst, "file", 30, "apos' pipe| [brackets]\r\nCRLF");
        result = new TestResult(*mock);
        result->setTotalExecutionTime(10);
        millisTime = 0;
        UT_PTR_SET(GetPlatformSpecificTimeInMillis, MockGetPlatformSpecificTimeInMillis);
    }